

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_getparam.c
# Opt level: O1

ParameterError parse_upload_flags(OperationConfig *config,char *flag)

{
  char cVar1;
  int iVar2;
  char *pcVar3;
  ulong uVar4;
  flagmap *pfVar5;
  char *__s2;
  size_t sVar6;
  bool bVar7;
  ParameterError err;
  ParameterError local_3c;
  
  local_3c = PARAM_OK;
  do {
    if (flag == (char *)0x0) {
      return local_3c;
    }
    pcVar3 = strchr(flag,0x2c);
    if (pcVar3 == (char *)0x0) {
      sVar6 = strlen(flag);
    }
    else {
      sVar6 = (long)pcVar3 - (long)flag;
    }
    cVar1 = *flag;
    uVar4 = (ulong)(cVar1 == '-');
    bVar7 = false;
    pfVar5 = flag_table;
    __s2 = "answered";
    do {
      pfVar5 = pfVar5 + 1;
      if ((sVar6 - uVar4 == pfVar5[-1].len) &&
         (iVar2 = strncmp(flag + uVar4,__s2,pfVar5[-1].len), iVar2 == 0)) {
        if (cVar1 == '-') {
          config->upload_flags = config->upload_flags & ~pfVar5[-1].flag;
        }
        else {
          config->upload_flags = config->upload_flags | pfVar5[-1].flag;
        }
        goto LAB_00113380;
      }
      __s2 = pfVar5->name;
      bVar7 = __s2 == (char *)0x0;
    } while (!bVar7);
    local_3c = PARAM_OPTION_UNKNOWN;
LAB_00113380:
    flag = pcVar3 + 1;
    if (pcVar3 == (char *)0x0) {
      flag = (char *)0x0;
    }
    if (bVar7) {
      return local_3c;
    }
  } while( true );
}

Assistant:

static ParameterError parse_upload_flags(struct OperationConfig *config,
                                         const char *flag)
{
  ParameterError err = PARAM_OK;

  while(flag) {
    bool negate;
    const struct flagmap *map;
    size_t len;
    char *next = strchr(flag, ','); /* Find next comma or end */
    if(next)
      len = next - flag;
    else
      len = strlen(flag);

    negate = (*flag == '-');
    if(negate) {
      flag++;
      len--;
    }

    for(map = flag_table; map->name; map++) {
      if((len == map->len) && !strncmp(flag, map->name, map->len)) {
        if(negate)
          config->upload_flags &= (unsigned char)~map->flag;
        else
          config->upload_flags |= map->flag;
        break;
      }
    }

   if(!map->name) {
     err = PARAM_OPTION_UNKNOWN;
     break;
   }

   if(next)
     /* move over the comma */
     next++;
   flag = next;
  }

  return err;
}